

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O2

hugeint_t duckdb::Hugeint::Multiply<true>(hugeint_t lhs,hugeint_t rhs)

{
  bool bVar1;
  OutOfRangeException *this;
  allocator local_a9;
  hugeint_t rhs_local;
  hugeint_t lhs_local;
  hugeint_t result;
  string local_78;
  string local_58;
  string local_38;
  
  rhs_local.upper = rhs.upper;
  rhs_local.lower = rhs.lower;
  lhs_local.upper = lhs.upper;
  lhs_local.lower = lhs.lower;
  bVar1 = TryMultiply(lhs,rhs,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Overflow in HUGEINT multiplication: %s + %s",&local_a9);
  hugeint_t::ToString_abi_cxx11_(&local_58,&lhs_local);
  hugeint_t::ToString_abi_cxx11_(&local_78,&rhs_local);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
            (this,&local_38,&local_58,&local_78);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline static hugeint_t Multiply(hugeint_t lhs, hugeint_t rhs) {
		hugeint_t result;
		if (!TryMultiply(lhs, rhs, result)) {
			throw OutOfRangeException("Overflow in HUGEINT multiplication: %s + %s", lhs.ToString(), rhs.ToString());
		}
		return result;
	}